

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

float nk_do_scrollbarv(nk_flags *state,nk_command_buffer *out,nk_rect scroll,int has_scrolling,
                      float offset,float target,float step,float button_pixel_inc,
                      nk_style_scrollbar *style,nk_input *in,nk_user_font *font)

{
  float fVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect cursor;
  nk_rect empty_north;
  nk_rect empty_south;
  float local_ec;
  nk_rect local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  nk_rect local_60;
  nk_rect local_50;
  nk_rect local_40;
  
  fStack_a4 = scroll.y;
  uVar2 = scroll._0_8_;
  local_d8.x = scroll.x;
  local_d8.y = fStack_a4;
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x35f9,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_scrollbar *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x35fa,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x35fb,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  local_50.w = 1.0;
  if (1.0 <= scroll.w) {
    local_50.w = scroll.w;
  }
  fVar6 = local_50.w + local_50.w;
  local_c8._4_4_ = 0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._0_4_ = fVar6;
  if (fVar6 <= scroll.h) {
    local_c8._0_4_ = scroll.h;
  }
  fVar5 = 0.0;
  if ((float)local_c8._0_4_ < target) {
    local_ec = offset;
    fStack_a0 = fStack_a4;
    fStack_9c = fStack_a4;
    local_d8.w = local_50.w;
    if (style->show_buttons != 0) {
      local_98 = ZEXT416((uint)fVar6);
      local_78._8_4_ = local_50.w;
      local_78._0_8_ = uVar2;
      local_78._12_4_ = local_c8._0_4_;
      fVar6 = step;
      if (button_pixel_inc <= step) {
        fVar6 = button_pixel_inc;
      }
      local_b8 = ZEXT416((uint)local_50.w);
      bounds.h = local_50.w;
      bounds.w = local_50.w;
      bounds.x = (float)(int)uVar2;
      bounds.y = (float)(int)((ulong)uVar2 >> 0x20);
      local_d8.h = (float)local_c8._0_4_;
      local_c8 = ZEXT416((uint)local_c8._0_4_);
      local_a8 = fStack_a4;
      local_88 = local_50.w;
      fStack_84 = local_50.w;
      fStack_80 = local_50.w;
      fStack_7c = local_50.w;
      iVar4 = nk_do_button_symbol((nk_flags *)&local_50,out,bounds,style->dec_symbol,
                                  NK_BUTTON_REPEATER,&style->dec_button,in,font);
      if (iVar4 != 0) {
        local_ec = offset - fVar6;
      }
      uVar3 = local_c8._0_4_;
      local_c8._0_4_ = (float)local_c8._0_4_ - (float)local_98._0_4_;
      bounds_00.h = fStack_84;
      bounds_00.w = local_88;
      bounds_00.y = ((float)uVar3 + local_a8) - (float)local_b8._0_4_;
      bounds_00.x = (float)local_78._0_4_;
      iVar4 = nk_do_button_symbol((nk_flags *)&local_50,out,bounds_00,style->inc_symbol,
                                  NK_BUTTON_REPEATER,&style->inc_button,in,font);
      if (iVar4 != 0) {
        local_ec = local_ec + fVar6;
      }
      local_d8.y = local_a8 + (float)local_b8._0_4_;
      local_50.w = (float)local_b8._0_4_;
    }
    if ((float)local_c8._0_4_ <= step) {
      step = (float)local_c8._0_4_;
    }
    if (target - (float)local_c8._0_4_ <= local_ec) {
      local_ec = target - (float)local_c8._0_4_;
    }
    fVar6 = 0.0;
    if (0.0 <= local_ec) {
      fVar6 = local_ec;
    }
    fVar5 = style->border;
    fVar1 = (style->padding).y;
    local_60.y = (fVar6 / target) * (float)local_c8._0_4_ + local_d8.y + fVar5 + fVar1;
    local_60.h = ((float)local_c8._0_4_ / target) * (float)local_c8._0_4_ -
                 (fVar1 + fVar1 + fVar5 + fVar5);
    fVar1 = (style->padding).x;
    local_60.x = fVar5 + local_d8.x + fVar1;
    local_60.w = local_50.w - (fVar1 + fVar1 + fVar5 + fVar5);
    local_50.x = local_d8.x;
    local_40.y = local_60.h + local_60.y;
    local_50.h = local_60.y - local_d8.y;
    local_40.x = local_d8.x;
    local_40.h = ((float)local_c8._0_4_ + local_d8.y) - local_40.y;
    local_d8.h = (float)local_c8._0_4_;
    local_a8 = local_d8.y;
    local_50.y = local_d8.y;
    local_40.w = local_50.w;
    fVar6 = nk_scrollbar_behavior
                      (state,in,has_scrolling,&local_d8,&local_60,&local_50,&local_40,fVar6,target,
                       step,NK_VERTICAL);
    local_b8._0_4_ = fVar6;
    local_60.y = (fVar6 / target) * (float)local_c8._0_4_ + local_a8 + style->border_cursor +
                 (style->padding).y;
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    nk_draw_scrollbar(out,*state,style,&local_d8,&local_60);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
    fVar5 = (float)local_b8._0_4_;
  }
  return fVar5;
}

Assistant:

NK_INTERN float
nk_do_scrollbarv(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect scroll, int has_scrolling,
    float offset, float target, float step, float button_pixel_inc,
    const struct nk_style_scrollbar *style, struct nk_input *in,
    const struct nk_user_font *font)
{
    struct nk_rect empty_north;
    struct nk_rect empty_south;
    struct nk_rect cursor;

    float scroll_step;
    float scroll_offset;
    float scroll_off;
    float scroll_ratio;

    NK_ASSERT(out);
    NK_ASSERT(style);
    NK_ASSERT(state);
    if (!out || !style) return 0;

    scroll.w = NK_MAX(scroll.w, 1);
    scroll.h = NK_MAX(scroll.h, 2 * scroll.w);
    if (target <= scroll.h) return 0;

    /* optional scrollbar buttons */
    if (style->show_buttons) {
        nk_flags ws;
        float scroll_h;
        struct nk_rect button;

        button.x = scroll.x;
        button.w = scroll.w;
        button.h = scroll.w;

        scroll_h = scroll.h - 2 * button.h;
        scroll_step = NK_MIN(step, button_pixel_inc);

        /* decrement button */
        button.y = scroll.y;
        if (nk_do_button_symbol(&ws, out, button, style->dec_symbol,
            NK_BUTTON_REPEATER, &style->dec_button, in, font))
            offset = offset - scroll_step;

        /* increment button */
        button.y = scroll.y + scroll.h - button.h;
        if (nk_do_button_symbol(&ws, out, button, style->inc_symbol,
            NK_BUTTON_REPEATER, &style->inc_button, in, font))
            offset = offset + scroll_step;

        scroll.y = scroll.y + button.h;
        scroll.h = scroll_h;
    }

    /* calculate scrollbar constants */
    scroll_step = NK_MIN(step, scroll.h);
    scroll_offset = NK_CLAMP(0, offset, target - scroll.h);
    scroll_ratio = scroll.h / target;
    scroll_off = scroll_offset / target;

    /* calculate scrollbar cursor bounds */
    cursor.h = (scroll_ratio * scroll.h) - (2*style->border + 2*style->padding.y);
    cursor.y = scroll.y + (scroll_off * scroll.h) + style->border + style->padding.y;
    cursor.w = scroll.w - (2 * style->border + 2 * style->padding.x);
    cursor.x = scroll.x + style->border + style->padding.x;

    /* calculate empty space around cursor */
    empty_north.x = scroll.x;
    empty_north.y = scroll.y;
    empty_north.w = scroll.w;
    empty_north.h = cursor.y - scroll.y;

    empty_south.x = scroll.x;
    empty_south.y = cursor.y + cursor.h;
    empty_south.w = scroll.w;
    empty_south.h = (scroll.y + scroll.h) - (cursor.y + cursor.h);

    /* update scrollbar */
    scroll_offset = nk_scrollbar_behavior(state, in, has_scrolling, &scroll, &cursor,
        &empty_north, &empty_south, scroll_offset, target, scroll_step, NK_VERTICAL);
    scroll_off = scroll_offset / target;
    cursor.y = scroll.y + (scroll_off * scroll.h) + style->border_cursor + style->padding.y;

    /* draw scrollbar */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_scrollbar(out, *state, style, &scroll, &cursor);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return scroll_offset;
}